

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim.cpp
# Opt level: O2

void __thiscall amrex::algoim::compute_integrals(algoim *this,MultiFab *intgmf,IntVect nghost)

{
  double dVar1;
  double dVar2;
  int iVar3;
  EBCellFlagFab *this_00;
  EBCellFlag *pEVar4;
  FabType FVar5;
  uint uVar6;
  EBFArrayBoxFactory *this_01;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined8 *puVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  bool bVar21;
  Real r;
  double dVar22;
  Box local_225c;
  Array4<double> local_2240;
  long local_2200;
  IntVect local_21f4;
  MultiCutFab *local_21e8;
  MultiCutFab *local_21e0;
  FabArray<amrex::EBCellFlagFab> *local_21d8;
  FabArray<amrex::FArrayBox> *local_21d0;
  long local_21c8;
  long local_21c0;
  long local_21b8;
  EBCellFlag *local_21b0;
  long local_21a8;
  long local_21a0;
  long local_2198;
  long local_2190;
  long local_2188;
  EBCellFlag *local_2180;
  long local_2178;
  long local_2170;
  long local_2168;
  EBPlane phi;
  Array4<const_double> local_2130;
  Array4<const_double> local_20f0;
  MFIter mfi;
  MFItInfo local_204c;
  QuadratureRule q;
  
  local_21f4.vect[0] = (int)*(undefined8 *)(this + 0xc0);
  if ((int)intgmf < local_21f4.vect[0]) {
    local_21f4.vect[0] = (int)intgmf;
  }
  iVar14 = (int)((ulong)intgmf >> 0x20);
  local_21f4.vect[1] = (int)((ulong)*(undefined8 *)(this + 0xc0) >> 0x20);
  if (iVar14 < local_21f4.vect[1]) {
    local_21f4.vect[1] = iVar14;
  }
  local_21f4.vect[2] = nghost.vect[0];
  if (*(int *)(this + 200) < nghost.vect[0]) {
    local_21f4.vect[2] = *(int *)(this + 200);
  }
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast(*(undefined8 *)(this + 0xf0),&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_01 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_21e0 = EBFArrayBoxFactory::getBndryCent(this_01);
  local_21e8 = EBFArrayBoxFactory::getBndryNormal(this_01);
  local_21d8 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
  local_204c.num_streams = Gpu::Device::max_gpu_streams;
  local_204c.do_tiling = true;
  local_204c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_204c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_204c.tilesize.vect[2] = DAT_006ddef0;
  local_204c.dynamic = true;
  local_204c.device_sync = true;
  local_21d0 = (FabArray<amrex::FArrayBox> *)this;
  MFIter::MFIter(&mfi,(FabArrayBase *)this,&local_204c);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_225c,&mfi,&local_21f4);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2240,local_21d0,&mfi);
    piVar7 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this_00 = (local_21d8->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar7];
    FVar5 = EBCellFlagFab::getType(this_00,&local_225c);
    if (FVar5 == regular) {
      for (lVar10 = (long)local_225c.smallend.vect[2]; lVar16 = (long)local_225c.smallend.vect[1],
          (int)lVar10 <= local_225c.bigend.vect[2]; lVar10 = lVar10 + 1) {
        for (; (int)lVar16 <= local_225c.bigend.vect[1]; lVar16 = lVar16 + 1) {
          pdVar19 = local_2240.p +
                    (long)local_225c.smallend.vect[0] +
                    (((lVar10 - local_2240.begin.z) * local_2240.kstride +
                     (lVar16 - local_2240.begin.y) * local_2240.jstride) - (long)local_2240.begin.x)
          ;
          for (lVar18 = (long)local_225c.smallend.vect[0]; lVar18 <= local_225c.bigend.vect[0];
              lVar18 = lVar18 + 1) {
            *pdVar19 = 0.0;
            pdVar19[local_2240.nstride] = 0.0;
            pdVar19[local_2240.nstride * 2] = 0.0;
            pdVar19[local_2240.nstride * 3] = 0.08333333333333333;
            pdVar19[local_2240.nstride * 4] = 0.08333333333333333;
            pdVar19[local_2240.nstride * 5] = 0.08333333333333333;
            pdVar19[local_2240.nstride * 6] = 0.0;
            pdVar19[local_2240.nstride * 7] = 0.0;
            pdVar19[local_2240.nstride * 8] = 0.0;
            pdVar19[local_2240.nstride * 9] = 0.0;
            pdVar19[local_2240.nstride * 10] = 0.0;
            pdVar19[local_2240.nstride * 0xb] = 0.0;
            pdVar19[local_2240.nstride * 0xc] = 0.0;
            pdVar19[local_2240.nstride * 0xd] = 0.0;
            pdVar19[local_2240.nstride * 0xe] = 0.0;
            pdVar19[local_2240.nstride * 0xf] = 0.006944444444444444;
            pdVar19[local_2240.nstride * 0x10] = 0.006944444444444444;
            pdVar19[local_2240.nstride * 0x11] = 0.006944444444444444;
            pdVar19[local_2240.nstride * 0x12] = 0.0;
            pdVar19 = pdVar19 + 1;
          }
        }
      }
    }
    else if (FVar5 == covered) {
      local_2200 = (long)local_225c.smallend.vect[2];
      lVar16 = 0;
      for (lVar10 = 0; lVar18 = local_2200, lVar10 != 0x13; lVar10 = lVar10 + 1) {
        for (; lVar20 = (long)local_225c.smallend.vect[1], (int)lVar18 <= local_225c.bigend.vect[2];
            lVar18 = lVar18 + 1) {
          for (; (int)lVar20 <= local_225c.bigend.vect[1]; lVar20 = lVar20 + 1) {
            puVar17 = (undefined8 *)
                      ((long)local_2240.p +
                      local_2240.nstride * lVar16 +
                      (lVar20 - local_2240.begin.y) * local_2240.jstride * 8 +
                      (lVar18 - local_2240.begin.z) * local_2240.kstride * 8 +
                      (long)local_2240.begin.x * -8 + (long)local_225c.smallend.vect[0] * 8);
            for (lVar13 = (long)local_225c.smallend.vect[0]; lVar13 <= local_225c.bigend.vect[0];
                lVar13 = lVar13 + 1) {
              *puVar17 = 0;
              puVar17 = puVar17 + 1;
            }
          }
        }
        lVar16 = lVar16 + 8;
      }
    }
    else {
      MultiCutFab::array(&local_20f0,local_21e0,&mfi);
      MultiCutFab::array(&local_2130,local_21e8,&mfi);
      local_21b0 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar14 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      local_2200 = (long)iVar14;
      iVar3 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_2188 = (long)iVar3;
      local_21b8 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_2190 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                          iVar14) + 1);
      local_21c0 = (((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar3) + 1)
                   * local_2190;
      local_2198 = (long)local_225c.smallend.vect[0];
      local_21c8 = (long)local_225c.smallend.vect[1];
      lVar16 = (long)local_225c.bigend.vect[0];
      local_2178 = (long)local_225c.bigend.vect[1];
      local_21a8 = (long)local_225c.bigend.vect[2];
      local_21a0 = local_2198 * 8;
      for (lVar10 = (long)local_225c.smallend.vect[2]; lVar10 <= local_21a8; lVar10 = lVar10 + 1) {
        local_2180 = local_21b0 + (lVar10 - local_21b8) * local_21c0;
        local_2170 = lVar10;
        for (lVar18 = local_21c8; pEVar4 = local_2180, lVar18 <= local_2178; lVar18 = lVar18 + 1) {
          lVar8 = (lVar18 - local_2188) * local_2190;
          lVar13 = local_21a0;
          for (lVar20 = local_2198; lVar20 <= lVar16; lVar20 = lVar20 + 1) {
            uVar6 = pEVar4[lVar8 + (lVar20 - local_2200)].flag & 3;
            if (uVar6 == 0) {
              lVar11 = lVar20 - local_2240.begin.x;
              lVar12 = (lVar18 - local_2240.begin.y) * local_2240.jstride;
              lVar10 = (lVar10 - local_2240.begin.z) * local_2240.kstride;
              local_2240.p[lVar12 + lVar11 + lVar10] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 2] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 3] = 0.08333333333333333;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 4] = 0.08333333333333333;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 5] = 0.08333333333333333;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 6] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 7] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 8] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 9] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 10] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0xb] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0xc] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0xd] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0xe] = 0.0;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0xf] =
                   0.006944444444444444;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0x10] =
                   0.006944444444444444;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0x11] =
                   0.006944444444444444;
              local_2240.p[lVar12 + lVar11 + lVar10 + local_2240.nstride * 0x12] = 0.0;
              lVar10 = local_2170;
              local_2168 = lVar20;
            }
            else if (uVar6 == 3) {
              puVar17 = (undefined8 *)
                        (lVar13 + (lVar10 - local_2240.begin.z) * local_2240.kstride * 8 +
                         (lVar18 - local_2240.begin.y) * local_2240.jstride * 8 +
                         (long)local_2240.begin.x * -8 + (long)local_2240.p);
              lVar11 = 0x13;
              while (bVar21 = lVar11 != 0, lVar11 = lVar11 + -1, bVar21) {
                *puVar17 = 0;
                puVar17 = puVar17 + local_2240.nstride;
              }
            }
            else {
              lVar12 = (lVar18 - local_20f0.begin.y) * local_20f0.jstride;
              lVar15 = (lVar10 - local_20f0.begin.z) * local_20f0.kstride;
              lVar11 = lVar20 - local_20f0.begin.x;
              phi.cent.arr[0] = local_20f0.p[lVar12 + lVar11 + lVar15];
              phi.cent.arr[1] = local_20f0.p[lVar12 + lVar11 + lVar15 + local_20f0.nstride];
              phi.cent.arr[2] = local_20f0.p[lVar12 + lVar11 + lVar15 + local_20f0.nstride * 2];
              lVar11 = lVar20 - local_2130.begin.x;
              lVar12 = (lVar18 - local_2130.begin.y) * local_2130.jstride;
              lVar15 = (lVar10 - local_2130.begin.z) * local_2130.kstride;
              phi.norm.arr[0] = local_2130.p[lVar12 + lVar11 + lVar15];
              phi.norm.arr[1] = local_2130.p[lVar12 + lVar11 + lVar15 + local_2130.nstride];
              phi.norm.arr[2] = local_2130.p[lVar12 + lVar11 + lVar15 + local_2130.nstride * 2];
              quadGen(&q,&phi);
              uVar9 = (ulong)(uint)q.nnodes;
              if (q.nnodes < 1) {
                uVar9 = 0;
              }
              lVar11 = uVar9 * 0x20;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19 = local_2240.p +
                        (lVar18 - local_2240.begin.y) * local_2240.jstride +
                        (lVar20 - local_2240.begin.x) +
                        (lVar10 - local_2240.begin.z) * local_2240.kstride;
              *pdVar19 = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].y + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 2] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].x + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 3] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].y + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 4] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].z + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 5] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].y + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 6] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 7] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].y + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 8] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].x + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].y + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 9] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].x + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 10] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].y + lVar12);
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) * dVar1 * dVar1 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0xb] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].y + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0xc] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].z + lVar12);
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) * dVar1 * dVar1 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0xd] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].z + lVar12);
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].y + lVar12) * dVar1 * dVar1 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0xe] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].x + lVar12);
                dVar2 = *(double *)((long)&q.nodes.arr[0].y + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * dVar2 * dVar2 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0xf] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].x + lVar12);
                dVar2 = *(double *)((long)&q.nodes.arr[0].z + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * dVar2 * dVar2 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0x10] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar1 = *(double *)((long)&q.nodes.arr[0].y + lVar12);
                dVar2 = *(double *)((long)&q.nodes.arr[0].z + lVar12);
                dVar22 = dVar22 + dVar1 * dVar1 * dVar2 * dVar2 *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0x11] = dVar22;
              dVar22 = 0.0;
              for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 0x20) {
                dVar22 = dVar22 + *(double *)((long)&q.nodes.arr[0].x + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].y + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].z + lVar12) *
                                  *(double *)((long)&q.nodes.arr[0].w + lVar12);
              }
              pdVar19[local_2240.nstride * 0x12] = dVar22;
            }
            lVar13 = lVar13 + 8;
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
compute_integrals (MultiFab& intgmf, IntVect nghost)
{
#if (AMREX_SPACEDIM == 2)
    amrex::ignore_unused(intgmf, nghost);
    amrex::Abort("amrex::algoim::compute_integrals is 3D only");
#else

    nghost.min(intgmf.nGrowVect());
    AMREX_ASSERT(intgmf.nComp() >= numIntgs);

    const auto& my_factory = dynamic_cast<EBFArrayBoxFactory const&>(intgmf.Factory());

    // const MultiFab&    vfrac = my_factory.getVolFrac();
    const MultiCutFab& bcent = my_factory.getBndryCent();
    const MultiCutFab& bnorm = my_factory.getBndryNormal();
    const auto&        flags = my_factory.getMultiEBCellFlagFab();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(intgmf,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        Array4<Real> const& intg = intgmf.array(mfi);

        const auto& flagfab = flags[mfi];
        auto typ = flagfab.getType(bx);

        if (typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_FOR_4D ( bx, numIntgs, i, j, k, n,
            {
                intg(i,j,k,n) = 0.0;
            });
        }
        else if (typ == FabType::regular)
        {
            AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
            {
                set_regular(i,j,k,intg);
            });
        }
        else
        {
            // auto const& vf = vfrac.array(mfi);
            auto const& bc = bcent.array(mfi);
            auto const& bn = bnorm.array(mfi);
            auto const& fg = flagfab.array();

            if (Gpu::inLaunchRegion())
            {
                amrex::ParallelFor(bx,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                });
            }
            else
            {
                const auto lo = amrex::lbound(bx);
                const auto hi = amrex::ubound(bx);
                for (int k = lo.z; k <= hi.z; ++k)
                for (int j = lo.y; j <= hi.y; ++j)
                for (int i = lo.x; i <= hi.x; ++i)
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q.eval([](Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                }
            }
        }
    }
#endif
}